

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldStateTest_SwapRepeatedDirty_Test::
~MapFieldStateTest_SwapRepeatedDirty_Test(MapFieldStateTest_SwapRepeatedDirty_Test *this)

{
  MapFieldStateTest::~MapFieldStateTest(&this->super_MapFieldStateTest);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_P(MapFieldStateTest, SwapRepeatedDirty) {
  ArenaHolder<MapFieldType> other(arena_.get());
  MakeRepeatedDirty(other.get());

  map_field_->Swap(other.get());

  Expect(map_field_.get(), REPEATED_DIRTY, 0, 1);

  switch (state_) {
    case CLEAN:
      Expect(other.get(), CLEAN, 1, 1);
      break;
    case MAP_DIRTY:
      Expect(other.get(), MAP_DIRTY, 1, 0);
      break;
    case REPEATED_DIRTY:
      Expect(other.get(), REPEATED_DIRTY, 0, 1);
      break;
    default:
      break;
  }
}